

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O2

void __thiscall capnp::compiler::Compiler::Impl::load(Impl *this,SchemaLoader *loader,uint64_t id)

{
  undefined1 local_20 [24];
  
  findNode((Impl *)local_20,(uint64_t)this);
  if ((_func_int **)local_20._0_8_ != (_func_int **)0x0) {
    Node::getBootstrapSchema((Node *)(local_20 + 8));
  }
  return;
}

Assistant:

void Compiler::Impl::load(const SchemaLoader& loader, uint64_t id) const {
  // We know that this load() is only called from the bootstrap loader which is already protected
  // by our mutex, so we can drop thread-safety.
  auto& self = const_cast<Compiler::Impl&>(*this);

  KJ_IF_SOME(node, self.findNode(id)) {
    node.getBootstrapSchema();
  }
}